

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minireflect.h
# Opt level: O2

void __thiscall flatbuffers::ToStringVisitor::Double(ToStringVisitor *this,double x)

{
  string local_30;
  
  NumToString<double>(&local_30,x);
  std::__cxx11::string::append((string *)&this->s);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Double(double x) { s += NumToString(x); }